

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

bool __thiscall
Js::ByteCodeWriter::TryWriteElementRootU<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (ByteCodeWriter *this,OpCode op,PropertyIdIndexType index)

{
  bool bVar1;
  unsigned_short local_22;
  PropertyIdIndexType local_20;
  OpLayoutT_ElementRootU<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> layout;
  PropertyIdIndexType index_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  local_20 = index;
  layout.PropertyIdIndex = op;
  bVar1 = LayoutSizePolicy<(Js::LayoutSize)0>::Assign<unsigned_short,unsigned_int>(&local_22,index);
  if (bVar1) {
    Data::EncodeT<(Js::LayoutSize)0>(&this->m_byteCodeData,layout.PropertyIdIndex,&local_22,2,this);
  }
  return bVar1;
}

Assistant:

bool ByteCodeWriter::TryWriteElementRootU(OpCode op, PropertyIdIndexType index)
    {
        OpLayoutT_ElementRootU<SizePolicy> layout;
        if (SizePolicy::Assign(layout.PropertyIdIndex, index))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }